

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
::Container::Container
          (Container *this,int d,
          CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
          *c)

{
  undefined4 in_ESI;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
  *in_RDI;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
  *in_stack_ffffffffffffff98;
  
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
  ::CustomFunctionalConstraint(in_RDI,in_stack_ffffffffffffff98);
  ExprWrapper<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
  ::ExprWrapper((ExprWrapper<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>_>
                 *)in_RDI,in_stack_ffffffffffffff98);
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
  ::~CustomFunctionalConstraint
            ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::LogAId>
              *)0x3c45ab);
  *(undefined4 *)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_ = in_ESI;
  Context::Context((Context *)
                   &in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_.field_0x4,
                   CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length
       = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length + 1) =
       0;
  *(undefined1 *)
   ((long)&in_RDI[1].super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length + 2) =
       0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }